

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_and_handles.h
# Opt level: O1

string * Uint32ToHexString_abi_cxx11_(uint32_t val)

{
  byte bVar1;
  pointer pcVar2;
  long lVar3;
  string *out;
  string *in_RDI;
  byte local_c [4];
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct((ulong)in_RDI,'\n');
  *(in_RDI->_M_dataplus)._M_p = '0';
  (in_RDI->_M_dataplus)._M_p[1] = 'x';
  pcVar2 = (in_RDI->_M_dataplus)._M_p + (in_RDI->_M_string_length - 1);
  lVar3 = 0;
  do {
    bVar1 = local_c[lVar3];
    *pcVar2 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 & 0xf];
    pcVar2[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 >> 4];
    lVar3 = lVar3 + 1;
    pcVar2 = pcVar2 + -2;
  } while (lVar3 != 4);
  return in_RDI;
}

Assistant:

inline std::string Uint32ToHexString(uint32_t val) { return to_hex(val); }